

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

void __thiscall
testing::internal::GTestLog::GTestLog(GTestLog *this,GTestLogSeverity severity,char *file,int line)

{
  ostream *poVar1;
  char *pcVar2;
  char *local_80;
  char *local_78;
  char *local_70;
  internal local_50 [32];
  char *local_30;
  char *marker;
  char *pcStack_20;
  int line_local;
  char *file_local;
  GTestLog *pGStack_10;
  GTestLogSeverity severity_local;
  GTestLog *this_local;
  
  this->severity_ = severity;
  if (severity == GTEST_INFO) {
    local_70 = "[  INFO ]";
  }
  else {
    if (severity == GTEST_WARNING) {
      local_78 = "[WARNING]";
    }
    else {
      if (severity == GTEST_ERROR) {
        local_80 = "[ ERROR ]";
      }
      else {
        local_80 = "[ FATAL ]";
      }
      local_78 = local_80;
    }
    local_70 = local_78;
  }
  local_30 = local_70;
  marker._4_4_ = line;
  pcStack_20 = file;
  file_local._4_4_ = severity;
  pGStack_10 = this;
  poVar1 = GetStream(this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1," ");
  FormatFileLocation_abi_cxx11_(local_50,pcStack_20,marker._4_4_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

GTestLog::GTestLog(GTestLogSeverity severity, const char* file, int line)
    : severity_(severity) {
  const char* const marker =
      severity == GTEST_INFO ?    "[  INFO ]" :
      severity == GTEST_WARNING ? "[WARNING]" :
      severity == GTEST_ERROR ?   "[ ERROR ]" : "[ FATAL ]";
  GetStream() << ::std::endl << marker << " "
              << FormatFileLocation(file, line).c_str() << ": ";
}